

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O0

string * diplo::memory_usage_abi_cxx11_(void)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  long lVar4;
  string *in_RDI;
  allocator local_249;
  undefined4 local_248;
  istream local_238 [8];
  ifstream my;
  string local_30 [8];
  string l;
  
  std::__cxx11::string::string(local_30);
  std::ifstream::ifstream(local_238,"/proc/self/status",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
LAB_001797a7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"no data",&local_249);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
  }
  else {
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_238,local_30);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) {
        std::ifstream::close();
        goto LAB_001797a7;
      }
      lVar4 = std::__cxx11::string::find((char *)local_30,0x1ca054);
    } while (lVar4 == -1);
    std::__cxx11::string::string((string *)in_RDI,local_30);
  }
  local_248 = 1;
  std::ifstream::~ifstream(local_238);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string diplo::memory_usage() {
    string l;
    ifstream my("/proc/self/status");
    if (my.is_open()) {
        while (getline(my, l)) {
            if (l.find("VmSize:") != string::npos) {
                return l;
            }
        }
        my.close();
    }
    return "no data";

}